

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O3

uint64_t chacha_get_counter(chacha_state *S)

{
  return *(uint64_t *)(S->opaque + 0x20);
}

Assistant:

uint64_t
chacha_get_counter(chacha_state *S) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    return 
        ((uint64_t)state->s[32]      ) |
        ((uint64_t)state->s[33] <<  8) |
        ((uint64_t)state->s[34] << 16) |
        ((uint64_t)state->s[35] << 24) |
        ((uint64_t)state->s[36] << 32) |
        ((uint64_t)state->s[37] << 40) |
        ((uint64_t)state->s[38] << 48) |
        ((uint64_t)state->s[39] << 56);
}